

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_ULong FT_Stream_TryRead(FT_Stream stream,FT_Byte *buffer,FT_ULong count)

{
  unsigned_long local_28;
  FT_ULong read_bytes;
  FT_ULong count_local;
  FT_Byte *buffer_local;
  FT_Stream stream_local;
  
  local_28 = 0;
  if (stream->pos < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      local_28 = stream->size - stream->pos;
      if (count < local_28) {
        local_28 = count;
      }
      memcpy(buffer,stream->base + stream->pos,local_28);
    }
    else {
      local_28 = (*stream->read)(stream,stream->pos,buffer,count);
    }
    stream->pos = local_28 + stream->pos;
  }
  return local_28;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_TryRead( FT_Stream  stream,
                     FT_Byte*   buffer,
                     FT_ULong   count )
  {
    FT_ULong  read_bytes = 0;


    if ( stream->pos >= stream->size )
      goto Exit;

    if ( stream->read )
      read_bytes = stream->read( stream, stream->pos, buffer, count );
    else
    {
      read_bytes = stream->size - stream->pos;
      if ( read_bytes > count )
        read_bytes = count;

      FT_MEM_COPY( buffer, stream->base + stream->pos, read_bytes );
    }

    stream->pos += read_bytes;

  Exit:
    return read_bytes;
  }